

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O1

int32_t zng_deflateGetParams(zng_stream *strm,zng_deflate_param_value *params,size_t count)

{
  zng_deflate_param zVar1;
  internal_state *piVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  int iVar5;
  int32_t iVar6;
  ulong uVar7;
  bool bVar8;
  int32_t *piVar9;
  int32_t iVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  long lVar13;
  
  auVar4 = _DAT_00179430;
  if (count != 0) {
    uVar7 = count + 3 & 0xfffffffffffffffc;
    lVar13 = count - 1;
    auVar11._8_4_ = (int)lVar13;
    auVar11._0_8_ = lVar13;
    auVar11._12_4_ = (int)((ulong)lVar13 >> 0x20);
    piVar9 = &params[3].status;
    auVar11 = auVar11 ^ _DAT_00179430;
    auVar12 = _DAT_00179410;
    auVar14 = _DAT_00179420;
    do {
      auVar15 = auVar14 ^ auVar4;
      iVar5 = auVar11._4_4_;
      if ((bool)(~(auVar15._4_4_ == iVar5 && auVar11._0_4_ < auVar15._0_4_ || iVar5 < auVar15._4_4_)
                & 1)) {
        piVar9[-0x18] = 0;
      }
      if ((auVar15._12_4_ != auVar11._12_4_ || auVar15._8_4_ <= auVar11._8_4_) &&
          auVar15._12_4_ <= auVar11._12_4_) {
        piVar9[-0x10] = 0;
      }
      auVar15 = auVar12 ^ auVar4;
      iVar16 = auVar15._4_4_;
      if (iVar16 <= iVar5 && (iVar16 != iVar5 || auVar15._0_4_ <= auVar11._0_4_)) {
        piVar9[-8] = 0;
        *piVar9 = 0;
      }
      lVar13 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 4;
      auVar14._8_8_ = lVar13 + 4;
      lVar13 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 4;
      auVar12._8_8_ = lVar13 + 4;
      piVar9 = piVar9 + 0x20;
      uVar7 = uVar7 - 4;
    } while (uVar7 != 0);
  }
  iVar5 = deflateStateCheck(strm);
  iVar6 = -2;
  if (iVar5 == 0) {
    if (count == 0) {
      iVar6 = 0;
    }
    else {
      piVar2 = strm->state;
      piVar9 = &params->status;
      bVar8 = false;
      bVar3 = false;
      do {
        zVar1 = ((zng_deflate_param_value *)(piVar9 + -6))->param;
        if (zVar1 == Z_DEFLATE_REPRODUCIBLE) {
          if (3 < *(ulong *)(piVar9 + -2)) {
            iVar5 = piVar2->reproducible;
            goto LAB_001325c1;
          }
LAB_001325a7:
          *piVar9 = -5;
        }
        else {
          if (zVar1 == Z_DEFLATE_STRATEGY) {
            if (*(ulong *)(piVar9 + -2) < 4) goto LAB_001325a7;
            iVar5 = piVar2->strategy;
          }
          else {
            if (zVar1 != Z_DEFLATE_LEVEL) {
              *piVar9 = -6;
              bVar8 = true;
              goto LAB_001325c8;
            }
            if (*(ulong *)(piVar9 + -2) < 4) goto LAB_001325a7;
            iVar5 = piVar2->level;
          }
LAB_001325c1:
          **(int **)(piVar9 + -4) = iVar5;
        }
LAB_001325c8:
        if (*piVar9 == -5) {
          bVar3 = true;
        }
        piVar9 = piVar9 + 8;
        count = count - 1;
      } while (count != 0);
      iVar10 = -6;
      if (!bVar8) {
        iVar10 = 0;
      }
      iVar6 = -5;
      if (!bVar3) {
        iVar6 = iVar10;
      }
    }
  }
  return iVar6;
}

Assistant:

int32_t Z_EXPORT zng_deflateGetParams(zng_stream *strm, zng_deflate_param_value *params, size_t count) {
    deflate_state *s;
    size_t i;
    int32_t buf_error = 0;
    int32_t version_error = 0;

    /* Initialize the statuses. */
    for (i = 0; i < count; i++)
        params[i].status = Z_OK;

    /* Check whether the stream state is consistent. */
    if (deflateStateCheck(strm))
        return Z_STREAM_ERROR;
    s = strm->state;

    for (i = 0; i < count; i++) {
        switch (params[i].param) {
            case Z_DEFLATE_LEVEL:
                if (params[i].size < sizeof(int))
                    params[i].status = Z_BUF_ERROR;
                else
                    *(int *)params[i].buf = s->level;
                break;
            case Z_DEFLATE_STRATEGY:
                if (params[i].size < sizeof(int))
                    params[i].status = Z_BUF_ERROR;
                else
                    *(int *)params[i].buf = s->strategy;
                break;
            case Z_DEFLATE_REPRODUCIBLE:
                if (params[i].size < sizeof(int))
                    params[i].status = Z_BUF_ERROR;
                else
                    *(int *)params[i].buf = s->reproducible;
                break;
            default:
                params[i].status = Z_VERSION_ERROR;
                version_error = 1;
                break;
        }
        if (params[i].status == Z_BUF_ERROR)
            buf_error = 1;
    }
    return buf_error ? Z_BUF_ERROR : (version_error ? Z_VERSION_ERROR : Z_OK);
}